

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
detail::writer::operator()
          (writer *this,vector<example::option_t,_std::allocator<example::option_t>_> *vals)

{
  pointer poVar1;
  short sVar2;
  ulong uVar3;
  ulong uVar4;
  size_t __n;
  option_t *val;
  pointer poVar5;
  unsigned_short tmp;
  basic_iterator<boost::fusion::struct_iterator_tag,_boost::fusion::random_access_traversal_tag,_const_example::option_t,_0>
  local_50;
  writer local_48;
  
  sVar2 = (short)((uint)(*(int *)&(vals->
                                  super__Vector_base<example::option_t,_std::allocator<example::option_t>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                        *(int *)&(vals->
                                 super__Vector_base<example::option_t,_std::allocator<example::option_t>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_48.buf_.data_ =
       (void *)CONCAT62(local_48.buf_.data_._2_6_,sVar2 * -0x4900 | (ushort)(sVar2 * 0x6db7) >> 8);
  uVar3 = (this->buf_).size_;
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    __n = 2;
    if (uVar3 < 2) {
      __n = uVar3;
    }
    memcpy((this->buf_).data_,&local_48,__n);
    uVar3 = (this->buf_).size_;
  }
  uVar4 = 2;
  if (uVar3 < 2) {
    uVar4 = uVar3;
  }
  (this->buf_).data_ = (void *)((long)(this->buf_).data_ + uVar4);
  (this->buf_).size_ = uVar3 - uVar4;
  poVar5 = (vals->super__Vector_base<example::option_t,_std::allocator<example::option_t>_>)._M_impl
           .super__Vector_impl_data._M_start;
  poVar1 = (vals->super__Vector_base<example::option_t,_std::allocator<example::option_t>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  if (poVar5 != poVar1) {
    do {
      local_48.buf_.data_ = (this->buf_).data_;
      local_48.buf_.size_ = (this->buf_).size_;
      local_48.opts_.super__Base_bitset<1UL>._M_w =
           (_Base_bitset<1UL>)(this->opts_).super__Base_bitset<1UL>._M_w;
      local_48.optv_ = this->optv_;
      local_50.seq = poVar5;
      boost::fusion::detail::for_each_unrolled<7>::
      call<boost::fusion::basic_iterator<boost::fusion::struct_iterator_tag,boost::fusion::random_access_traversal_tag,example::option_t_const,0>,detail::writer>
                (&local_50,&local_48);
      poVar5 = poVar5 + 1;
    } while (poVar5 != poVar1);
  }
  return;
}

Assistant:

void operator()(std::vector<T> const& vals) const {
        (*this)(static_cast<uint16_t>(vals.size()));
        for (auto&& val : vals)
            (*this)(val);
    }